

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

Unary * __thiscall wasm::Builder::makeUnary(Builder *this,UnaryOp op,Expression *value)

{
  Unary *pUVar1;
  
  pUVar1 = (Unary *)MixedArena::allocSpace(&this->wasm->allocator,0x20,8);
  (pUVar1->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
  (pUVar1->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
  pUVar1->op = op;
  pUVar1->value = value;
  wasm::Unary::finalize();
  return pUVar1;
}

Assistant:

Unary* makeUnary(UnaryOp op, Expression* value) {
    auto* ret = wasm.allocator.alloc<Unary>();
    ret->op = op;
    ret->value = value;
    ret->finalize();
    return ret;
  }